

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::CopyImage::FunctionalTest::prepareTexture
          (FunctionalTest *this,targetDesc *desc,GLubyte **pixels,GLuint *out_buf_id)

{
  GLenum target;
  bool bVar1;
  GLuint name;
  long lVar2;
  GLuint depths [3];
  GLuint widths [3];
  GLuint heights [3];
  
  name = Utils::generateTexture((this->super_TestCase).m_context,desc->m_target);
  target = desc->m_target;
  bVar1 = Utils::isTargetMultilevel(target);
  if (bVar1) {
    calculateDimmensions
              ((FunctionalTest *)heights,target,desc->m_level,desc->m_width,desc->m_height,widths,
               heights,depths);
    for (lVar2 = -3; lVar2 != 0; lVar2 = lVar2 + 1) {
      Utils::prepareTexture
                ((this->super_TestCase).m_context,name,desc->m_target,desc->m_internal_format,
                 desc->m_format,desc->m_type,(int)lVar2 + 3,heights[lVar2],
                 *(GLuint *)(&stack0xffffffffffffffd0 + lVar2 * 4),widths[lVar2],pixels[lVar2 + 3],
                 out_buf_id);
      Utils::makeTextureComplete((this->super_TestCase).m_context,desc->m_target,name,0,2);
    }
  }
  else {
    Utils::prepareTexture
              ((this->super_TestCase).m_context,name,target,desc->m_internal_format,desc->m_format,
               desc->m_type,0,desc->m_width,desc->m_height,0xc,*pixels,out_buf_id);
    Utils::makeTextureComplete((this->super_TestCase).m_context,desc->m_target,name,0,0);
  }
  return name;
}

Assistant:

GLuint FunctionalTest::prepareTexture(const targetDesc& desc, const GLubyte** pixels, GLuint& out_buf_id)
{
	GLuint name = Utils::generateTexture(m_context, desc.m_target);

	if (false == Utils::isTargetMultilevel(desc.m_target))
	{
		Utils::prepareTexture(m_context, name, desc.m_target, desc.m_internal_format, desc.m_format, desc.m_type,
							  0 /* level */, desc.m_width, desc.m_height,
							  FUNCTIONAL_TEST_N_LAYERS /* depth - 12 for multilayered, 1D and 2D will ignore that */,
							  pixels[0], out_buf_id);

		Utils::makeTextureComplete(m_context, desc.m_target, name, 0 /* base */, 0 /* max */);
	}
	else
	{
		/* Calculate dimmensions */
		GLuint heights[FUNCTIONAL_TEST_N_LEVELS];
		GLuint widths[FUNCTIONAL_TEST_N_LEVELS];
		GLuint depths[FUNCTIONAL_TEST_N_LEVELS];

		calculateDimmensions(desc.m_target, desc.m_level, desc.m_width, desc.m_height, widths, heights, depths);

		for (GLuint level = 0; level < FUNCTIONAL_TEST_N_LEVELS; ++level)
		{
			Utils::prepareTexture(m_context, name, desc.m_target, desc.m_internal_format, desc.m_format, desc.m_type,
								  level, widths[level], heights[level], depths[level], pixels[level], out_buf_id);

			Utils::makeTextureComplete(m_context, desc.m_target, name, 0 /* base */, 2 /* max */);
		}
	}

	return name;
}